

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O0

SubroutineSymbol *
slang::ast::SubroutineSymbol::createFromPrototype
          (Compilation *compilation,MethodPrototypeSymbol *prototype,Scope *parent)

{
  SubroutineSymbol *pSVar1;
  Compilation *in_RDX;
  MethodPrototypeSymbol *in_RSI;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> sVar2;
  SubroutineSymbol *result;
  Scope *in_stack_00000088;
  Compilation *in_stack_00000090;
  undefined1 in_stack_00000098 [16];
  undefined8 in_stack_ffffffffffffffb0;
  SymbolIndex index;
  undefined1 in_stack_ffffffffffffffb8 [16];
  undefined1 in_stack_ffffffffffffffc8 [16];
  uint in_stack_ffffffffffffffd8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffe0;
  
  index = (SymbolIndex)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  pSVar1 = BumpAllocator::
           emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::VariableLifetime,slang::ast::SubroutineKind_const&>
                     ((BumpAllocator *)in_RSI,in_RDX,in_stack_ffffffffffffffe0,
                      (SourceLocation *)(ulong)in_stack_ffffffffffffffd8,
                      in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_);
  Symbol::setParent(in_stack_ffffffffffffffb8._8_8_,in_stack_ffffffffffffffb8._0_8_,index);
  DeclaredType::setLink(&pSVar1->declaredReturnType,&in_RSI->declaredReturnType);
  pSVar1->visibility = in_RSI->visibility;
  (pSVar1->flags).m_bits = (in_RSI->flags).m_bits;
  MethodPrototypeSymbol::getArguments(in_RSI);
  sVar2 = cloneArguments(in_stack_00000090,in_stack_00000088,
                         (span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL>
                          )in_stack_00000098);
  (pSVar1->arguments)._M_ptr = sVar2._M_ptr;
  (pSVar1->arguments)._M_extent._M_extent_value = sVar2._M_extent._M_extent_value._M_extent_value;
  pSVar1->prototype = in_RSI;
  return pSVar1;
}

Assistant:

SubroutineSymbol& SubroutineSymbol::createFromPrototype(Compilation& compilation,
                                                        const MethodPrototypeSymbol& prototype,
                                                        const Scope& parent) {
    // Create a stub subroutine symbol that exists only to allow the normal expression
    // machinery to call it (checking argument types, return values, etc).
    auto result = compilation.emplace<SubroutineSymbol>(compilation, prototype.name,
                                                        prototype.location,
                                                        VariableLifetime::Automatic,
                                                        prototype.subroutineKind);

    result->setParent(parent, SymbolIndex(INT32_MAX));
    result->declaredReturnType.setLink(prototype.declaredReturnType);
    result->visibility = prototype.visibility;
    result->flags = prototype.flags;
    result->arguments = cloneArguments(compilation, *result, prototype.getArguments());
    result->prototype = &prototype;
    return *result;
}